

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O2

void __thiscall Js::DebugContext::Close(DebugContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->field_0x1c & 1) == 0) {
    if (this->scriptContext->isScriptContextActuallyClosed == true) {
      this->field_0x1c = this->field_0x1c | 1;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                  ,0x2b,"(this->scriptContext->IsActuallyClosed())",
                                  "Closing DebugContext before ScriptContext close might have consequences"
                                 );
      if (!bVar2) {
LAB_007df80a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      this->field_0x1c = this->field_0x1c | 1;
      if (this->scriptContext == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                    ,0x31,"(this->scriptContext != nullptr)",
                                    "this->scriptContext != nullptr");
        if (!bVar2) goto LAB_007df80a;
        *puVar3 = 0;
      }
    }
    if (this->diagProbesContainer != (ProbeContainer *)0x0) {
      ProbeContainer::Close(this->diagProbesContainer);
      Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::ProbeContainer>
                (&Memory::HeapAllocator::Instance,this->diagProbesContainer);
      this->diagProbesContainer = (ProbeContainer *)0x0;
    }
    if (this->hostDebugContext != (HostDebugContext *)0x0) {
      (**this->hostDebugContext->_vptr_HostDebugContext)();
      this->hostDebugContext = (HostDebugContext *)0x0;
    }
  }
  return;
}

Assistant:

void DebugContext::Close()
    {
        if (this->isClosed)
        {
            return;
        }

        AssertMsg(this->scriptContext->IsActuallyClosed(), "Closing DebugContext before ScriptContext close might have consequences");

        this->isClosed = true;

        // Release all memory and do all cleanup. No operation should be done after isClosed is set

        Assert(this->scriptContext != nullptr);

        if (this->diagProbesContainer != nullptr)
        {
            this->diagProbesContainer->Close();
            HeapDelete(this->diagProbesContainer);
            this->diagProbesContainer = nullptr;
        }

        if (this->hostDebugContext != nullptr)
        {
            this->hostDebugContext->Delete();
            this->hostDebugContext = nullptr;
        }
    }